

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall cfd::core::Psbt::Psbt(Psbt *this,Psbt *psbt)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  GetData((ByteData *)&_Stack_28,psbt);
  Psbt(this,(ByteData *)&_Stack_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

Psbt::Psbt(const Psbt &psbt) : Psbt(psbt.GetData()) {
  // copy constructor
}